

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyPrefix
          (CordRepBtree *this,size_t n,bool allow_folding)

{
  CordRep *pCVar1;
  CordRepBtree *pCVar2;
  Position PVar3;
  CopyResult CVar4;
  CordRepBtree *nsub;
  CordRep *edge;
  size_t end;
  CordRepBtree *sub;
  Position pos;
  CordRep *front;
  CordRepBtree *node;
  int height;
  bool allow_folding_local;
  size_t n_local;
  CordRepBtree *this_local;
  CopyResult result;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f7,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  if ((this->super_CordRep).length < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f8,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  node._0_4_ = CordRepBtree::height(this);
  pos.n = (size_t)Edge(this,kFront);
  front = &this->super_CordRep;
  if (allow_folding) {
    while (n <= *(ulong *)pos.n) {
      node._0_4_ = (int)node + -1;
      if ((int)node < 0) {
        pCVar1 = CordRep::Ref((CordRep *)pos.n);
        this_local = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar1,0,n);
        result.edge._0_4_ = -1;
        goto LAB_0054491c;
      }
      front = &CordRep::btree((CordRep *)pos.n)->super_CordRep;
      pos.n = (size_t)Edge((CordRepBtree *)front,kFront);
    }
  }
  if (front->length == n) {
    this_local = (CordRepBtree *)CordRep::Ref(front);
    result.edge._0_4_ = (int)node;
  }
  else {
    _sub = IndexOf((CordRepBtree *)front,n);
    this_local = CopyBeginTo((CordRepBtree *)front,(size_t)sub,n);
    result.edge._0_4_ = (int)node;
    end = (size_t)this_local;
    while( true ) {
      if (pos.index == 0) break;
      pCVar1 = Edge((CordRepBtree *)front,(size_t)sub);
      node._0_4_ = (int)node + -1;
      if ((int)node < 0) {
        pCVar1 = CordRep::Ref(pCVar1);
        pCVar1 = anon_unknown_0::MakeSubstring(pCVar1,0,pos.index);
        *(CordRep **)(end + 0x10 + (long)sub * 8) = pCVar1;
        set_end((CordRepBtree *)end,(size_t)((long)&(sub->super_CordRep).length + 1));
        pCVar2 = CordRep::btree(&this_local->super_CordRep);
        AssertValid(pCVar2,true);
        goto LAB_0054491c;
      }
      front = &CordRep::btree(pCVar1)->super_CordRep;
      PVar3 = IndexOf((CordRepBtree *)front,pos.index);
      nsub = (CordRepBtree *)PVar3.index;
      pCVar2 = CopyBeginTo((CordRepBtree *)front,(size_t)nsub,pos.index);
      *(CordRepBtree **)(end + 0x10 + (long)sub * 8) = pCVar2;
      set_end((CordRepBtree *)end,(size_t)((long)&(sub->super_CordRep).length + 1));
      end = (size_t)pCVar2;
      _sub = PVar3;
    }
    set_end((CordRepBtree *)end,(size_t)sub);
    pCVar2 = CordRep::btree(&this_local->super_CordRep);
    AssertValid(pCVar2,true);
  }
LAB_0054491c:
  CVar4.height = (int)result.edge;
  CVar4.edge = &this_local->super_CordRep;
  CVar4._12_4_ = 0;
  return CVar4;
}

Assistant:

CopyResult CordRepBtree::CopyPrefix(size_t n, bool allow_folding) {
  assert(n > 0);
  assert(n <= this->length);

  // As long as `n` does not exceed the length of the first edge, we can 'drop'
  // the current depth. For the most extreme example: if we'd copy a 1 byte
  // prefix from a tree, there is only a single edge / path from the top of the
  // tree to the single data edge containing this byte, so we can drop all the
  // nodes except the data node.
  int height = this->height();
  CordRepBtree* node = this;
  CordRep* front = node->Edge(kFront);
  if (allow_folding) {
    while (front->length >= n) {
      if (--height < 0) return {MakeSubstring(CordRep::Ref(front), 0, n), -1};
      node = front->btree();
      front = node->Edge(kFront);
    }
  }
  if (node->length == n) return {CordRep::Ref(node), height};

  // `n` spans at least two nodes, find the end point of the span.
  Position pos = node->IndexOf(n);

  // Create a partial copy of the node up to `pos.index`, with a defined length
  // of `n`. Any 'partial last edge' is added further below as needed.
  CordRepBtree* sub = node->CopyBeginTo(pos.index, n);
  const CopyResult result = {sub, height};

  // `pos.n` contains the 'offset inside the edge for IndexOf(n)'. As long as
  // this is not zero, we don't have a 'clean cut', so we need to make a
  // (partial) copy of that last edge, and repeat this until pos.n is zero.
  while (pos.n != 0) {
    size_t end = pos.index;
    n = pos.n;

    CordRep* edge = node->Edge(pos.index);
    if (--height < 0) {
      sub->edges_[end++] = MakeSubstring(CordRep::Ref(edge), 0, n);
      sub->set_end(end);
      AssertValid(result.edge->btree());
      return result;
    }

    node = edge->btree();
    pos = node->IndexOf(n);
    CordRepBtree* nsub = node->CopyBeginTo(pos.index, n);
    sub->edges_[end++] = nsub;
    sub->set_end(end);
    sub = nsub;
  }
  sub->set_end(pos.index);
  AssertValid(result.edge->btree());
  return result;
}